

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeHostSystemInformationCommand.cxx
# Opt level: O0

string * __thiscall
(anonymous_namespace)::ValueToString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,char *value)

{
  allocator<char> local_19;
  _anonymous_namespace_ *local_18;
  char *value_local;
  
  local_18 = this;
  value_local = (char *)__return_storage_ptr__;
  if (this == (_anonymous_namespace_ *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,(char *)this,&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ValueToString(const char* const value)
{
  return value ? value : std::string{};
}